

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementHandle.cpp
# Opt level: O3

void __thiscall Rml::HandleEdgeMarginParser::HandleEdgeMarginParser(HandleEdgeMarginParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  PropertyId PVar3;
  PropertyId PVar4;
  PropertyId PVar5;
  PropertyId PVar6;
  ShorthandId SVar7;
  PropertyDefinition *pPVar8;
  String local_230;
  String local_210;
  String local_1f0;
  String local_1d0;
  String local_1b0;
  String local_190;
  String local_170;
  String local_150;
  String local_130;
  String local_110;
  String local_f0;
  String local_d0;
  String local_b0;
  String local_90;
  String local_70;
  String local_50;
  
  PropertySpecification::PropertySpecification(&this->specification,4,1);
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"edge-t","");
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
  pPVar8 = PropertySpecification::RegisterProperty
                     (&this->specification,&local_230,&local_210,false,false,Invalid);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"length_percent","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
  pPVar8 = PropertyDefinition::AddParser(pPVar8,&local_90,&local_b0);
  PVar3 = PropertyDefinition::GetId(pPVar8);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"edge-r","");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
  pPVar8 = PropertySpecification::RegisterProperty
                     (&this->specification,&local_d0,&local_f0,false,false,Invalid);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"length_percent","");
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"");
  pPVar8 = PropertyDefinition::AddParser(pPVar8,&local_110,&local_130);
  PVar4 = PropertyDefinition::GetId(pPVar8);
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"edge-b","");
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"");
  pPVar8 = PropertySpecification::RegisterProperty
                     (&this->specification,&local_150,&local_170,false,false,Invalid);
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"length_percent","");
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"");
  pPVar8 = PropertyDefinition::AddParser(pPVar8,&local_190,&local_1b0);
  PVar5 = PropertyDefinition::GetId(pPVar8);
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"edge-l","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  pPVar8 = PropertySpecification::RegisterProperty
                     (&this->specification,&local_1d0,&local_50,false,false,Invalid);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"length_percent","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pPVar8 = PropertyDefinition::AddParser(pPVar8,&local_1f0,&local_70);
  PVar6 = PropertyDefinition::GetId(pPVar8);
  (this->ids)._M_elems[0] = PVar3;
  (this->ids)._M_elems[1] = PVar4;
  (this->ids)._M_elems[2] = PVar5;
  (this->ids)._M_elems[3] = PVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_230.field_2;
  paVar2 = &local_210.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != paVar2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != paVar1) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  local_230._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"edge-margin","");
  local_210._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_210,"edge-t, edge-r, edge-b, edge-l","");
  SVar7 = PropertySpecification::RegisterShorthand
                    (&this->specification,&local_230,&local_210,Box,Invalid);
  this->id_constraint = SVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != paVar2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != paVar1) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

HandleEdgeMarginParser() : specification(4, 1)
	{
		ids = {
			specification.RegisterProperty("edge-t", "", false, false).AddParser("length_percent").GetId(),
			specification.RegisterProperty("edge-r", "", false, false).AddParser("length_percent").GetId(),
			specification.RegisterProperty("edge-b", "", false, false).AddParser("length_percent").GetId(),
			specification.RegisterProperty("edge-l", "", false, false).AddParser("length_percent").GetId(),
		};
		id_constraint = specification.RegisterShorthand("edge-margin", "edge-t, edge-r, edge-b, edge-l", ShorthandType::Box);
	}